

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_r6p_iter.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  
  bVar1 = testR6PIter();
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"R6PIter test did not pass\n",0x1a);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"R6PIter test passed\n",0x14);
  }
  return (uint)!bVar1;
}

Assistant:

int main(int argc, char ** argv){


if(testR6PIter()){
    std::cout << "R6PIter test passed\n";
}else{
    std::cerr << "R6PIter test did not pass\n";
    return 1;
};

return 0;
}